

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O2

int os_date(lua_State *L)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *__s1;
  tm *stm;
  char *__s2;
  size_t sVar4;
  char *pcVar5;
  char cc [4];
  time_t t;
  tm *local_4a8;
  char *local_4a0;
  char *local_498;
  size_t slen;
  tm tmr;
  luaL_Buffer b;
  
  __s1 = luaL_optlstring(L,1,"%c",&slen);
  iVar2 = lua_type(L,2);
  if (iVar2 < 1) {
    t = time((time_t *)0x0);
  }
  else {
    t = luaL_checkinteger(L,2);
  }
  pcVar5 = __s1 + slen;
  if (*__s1 == '!') {
    stm = gmtime_r(&t,(tm *)&tmr);
    __s1 = __s1 + 1;
  }
  else {
    stm = localtime_r(&t,(tm *)&tmr);
  }
  if (stm == (tm *)0x0) {
    iVar2 = luaL_error(L,"date result cannot be represented in this installation");
  }
  else {
    if (((*__s1 == '*') && (__s1[1] == 't')) && (__s1[2] == '\0')) {
      lua_createtable(L,0,9);
      setallfields(L,(tm *)stm);
    }
    else {
      cc[0] = '%';
      luaL_buffinit(L,&b);
      local_4a8 = (tm *)stm;
      local_4a0 = pcVar5;
      while (__s1 < pcVar5) {
        cVar1 = *__s1;
        if (cVar1 == '%') {
          local_498 = luaL_prepbuffsize(&b,0xfa);
          __s1 = __s1 + 1;
          iVar2 = 1;
          for (__s2 = 
               "aAbBcCdDeFgGhHIjmMnprRStTuUVwWxXyYzZ%||EcECExEXEyEYOdOeOHOIOmOMOSOuOUOVOwOWOy";
              *__s2 != '\0'; __s2 = __s2 + sVar4) {
            sVar4 = (size_t)iVar2;
            if ((long)pcVar5 - (long)__s1 < (long)sVar4) break;
            if (*__s2 == '|') {
              iVar2 = iVar2 + 1;
              sVar4 = (size_t)iVar2;
            }
            else {
              iVar3 = bcmp(__s1,__s2,sVar4);
              if (iVar3 == 0) {
                memcpy(cc + 1,__s1,sVar4);
                cc[sVar4 + 1] = '\0';
                __s1 = __s1 + sVar4;
                goto LAB_00141b98;
              }
            }
          }
          pcVar5 = lua_pushfstring(L,"invalid conversion specifier \'%%%s\'",__s1);
          luaL_argerror(L,1,pcVar5);
LAB_00141b98:
          sVar4 = strftime(local_498,0xfa,cc,(tm *)local_4a8);
          pcVar5 = local_4a0;
          b.n = b.n + sVar4;
        }
        else {
          if (b.size <= b.n) {
            luaL_prepbuffsize(&b,1);
            cVar1 = *__s1;
          }
          __s1 = __s1 + 1;
          b.b[b.n] = cVar1;
          b.n = b.n + 1;
        }
      }
      luaL_pushresult(&b);
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int os_date (lua_State *L) {
  size_t slen;
  const char *s = luaL_optlstring(L, 1, "%c", &slen);
  time_t t = luaL_opt(L, l_checktime, 2, time(NULL));
  const char *se = s + slen;  /* 's' end */
  struct tm tmr, *stm;
  if (*s == '!') {  /* UTC? */
    stm = l_gmtime(&t, &tmr);
    s++;  /* skip '!' */
  }
  else
    stm = l_localtime(&t, &tmr);
  if (stm == NULL)  /* invalid date? */
    return luaL_error(L,
                 "date result cannot be represented in this installation");
  if (strcmp(s, "*t") == 0) {
    lua_createtable(L, 0, 9);  /* 9 = number of fields */
    setallfields(L, stm);
  }
  else {
    char cc[4];  /* buffer for individual conversion specifiers */
    luaL_Buffer b;
    cc[0] = '%';
    luaL_buffinit(L, &b);
    while (s < se) {
      if (*s != '%')  /* not a conversion specifier? */
        luaL_addchar(&b, *s++);
      else {
        size_t reslen;
        char *buff = luaL_prepbuffsize(&b, SIZETIMEFMT);
        s++;  /* skip '%' */
        s = checkoption(L, s, se - s, cc + 1);  /* copy specifier to 'cc' */
        reslen = strftime(buff, SIZETIMEFMT, cc, stm);
        luaL_addsize(&b, reslen);
      }
    }
    luaL_pushresult(&b);
  }
  return 1;
}